

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O3

void __thiscall
mp::NLFeeder_Easy::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::SuffixWriterFactory>
          (NLFeeder_Easy *this,SuffixWriterFactory *swf)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this_00;
  ulong uVar7;
  long lVar8;
  double dVar9;
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  local_60;
  
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
              *)&(this->nlme_).suffixes_);
  p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      p_Var2 = p_Var3[3]._M_parent;
      p_Var5 = p_Var3[3]._M_left;
      uVar7 = 0;
      if (p_Var2 != p_Var5) {
        uVar7 = 0;
        p_Var6 = p_Var2;
        do {
          uVar7 = (ulong)((int)uVar7 + (uint)(*(double *)p_Var6 != 0.0));
          p_Var6 = (_Base_ptr)&p_Var6->_M_parent;
        } while (p_Var6 != p_Var5);
      }
      _Var1 = p_Var3[3]._M_color;
      this_00 = swf->nlw_;
      if ((_Var1 & 4) == _S_red) {
        if ((int)uVar7 != 0) {
          BinaryFormatter::apr
                    (&this_00->super_FormatterType,&this_00->nm,"S%d %d %s\n",(ulong)_Var1,uVar7,
                     *(undefined8 *)(p_Var3 + 1));
          this_00 = swf->nlw_;
          p_Var2 = p_Var3[3]._M_parent;
          p_Var5 = p_Var3[3]._M_left;
        }
        if (p_Var5 != p_Var2) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            dVar9 = *(double *)(&p_Var2->_M_color + uVar7 * 2);
            if ((dVar9 != 0.0) || (NAN(dVar9))) {
              if ((_Var1 & 3) == _S_red) {
                uVar4 = (ulong)*(uint *)((long)&((this->var_perm_).
                                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first +
                                        (lVar8 >> 0x1d));
              }
              else {
                uVar4 = uVar7 & 0xffffffff;
              }
              dVar9 = round(dVar9);
              BinaryFormatter::apr
                        (&this_00->super_FormatterType,&this_00->nm,"%d %d\n",uVar4,
                         (ulong)(uint)(int)dVar9);
              p_Var2 = p_Var3[3]._M_parent;
              p_Var5 = p_Var3[3]._M_left;
            }
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 0x100000000;
          } while (uVar7 < (ulong)((long)p_Var5 - (long)p_Var2 >> 3));
        }
      }
      else {
        if ((int)uVar7 != 0) {
          BinaryFormatter::apr
                    (&this_00->super_FormatterType,&this_00->nm,"S%d %d %s\n",(ulong)_Var1,uVar7,
                     *(undefined8 *)(p_Var3 + 1));
          this_00 = swf->nlw_;
          p_Var2 = p_Var3[3]._M_parent;
          p_Var5 = p_Var3[3]._M_left;
        }
        if (p_Var5 != p_Var2) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            if ((*(double *)(&p_Var2->_M_color + uVar7 * 2) != 0.0) ||
               (NAN(*(double *)(&p_Var2->_M_color + uVar7 * 2)))) {
              if ((_Var1 & 3) == _S_red) {
                uVar4 = (ulong)*(uint *)((long)&((this->var_perm_).
                                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first +
                                        (lVar8 >> 0x1d));
              }
              else {
                uVar4 = uVar7 & 0xffffffff;
              }
              BinaryFormatter::apr(&this_00->super_FormatterType,&this_00->nm,"%d %g\n",uVar4);
              p_Var2 = p_Var3[3]._M_parent;
              p_Var5 = p_Var3[3]._M_left;
            }
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 0x100000000;
          } while (uVar7 < (ulong)((long)p_Var5 - (long)p_Var2 >> 3));
        }
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void FeedSuffixes(SuffixWriterFactory& swf) {
    for (const auto& suf: NLME().Suffixes()) {
      int nnz=0;
      for (auto v: suf.values_)
        if (v)
          ++nnz;
      bool ifVars = (0==(suf.kind_&3));
      if (suf.kind_ & 4) {
        auto sw = swf.StartDblSuffix(
              suf.name_.c_str(), suf.kind_, nnz);
        for (size_t i=0; i<suf.values_.size(); ++i)
          if (suf.values_[i])
            sw.Write(ifVars ? VPerm(i) : i,
                     suf.values_[i]);
      } else {
        auto sw = swf.StartIntSuffix(
              suf.name_.c_str(), suf.kind_, nnz);
        for (size_t i=0; i<suf.values_.size(); ++i)
          if (suf.values_[i])
            sw.Write(ifVars ? VPerm(i) : i,
                     std::round(suf.values_[i]));
      }
    }
  }